

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int vec_eq(void *v,void *vv)

{
  uint uVar1;
  int iVar2;
  AbstractVec *avv;
  AbstractVec *av;
  ulong uVar3;
  
  uVar1 = *v;
  iVar2 = 0;
  if ((uVar1 == *vv) && (iVar2 = 1, (ulong)uVar1 != 0)) {
    uVar3 = 0;
    do {
      if (*(long *)(*(long *)((long)v + 8) + uVar3 * 8) !=
          *(long *)(*(long *)((long)vv + 8) + uVar3 * 8)) {
        return 0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return iVar2;
}

Assistant:

int vec_eq(void *v, void *vv) {
  AbstractVec *av = (AbstractVec *)v;
  AbstractVec *avv = (AbstractVec *)vv;
  uint i;

  if (av->n != avv->n) return 0;
  for (i = 0; i < av->n; i++)
    if (av->v[i] != avv->v[i]) return 0;
  return 1;
}